

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

longlong QString::toIntegral_helper<long_long>(QStringView string,bool *ok,int base)

{
  long lVar1;
  longlong lVar2;
  int in_EDX;
  bool *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  Int64 val;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = ::QString::toIntegral_helper(in_RDI,in_RSI,in_EDX);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return lVar2;
}

Assistant:

static
    T toIntegral_helper(QStringView string, bool *ok, int base)
    {
        using Int64 = typename std::conditional<std::is_unsigned<T>::value, qulonglong, qlonglong>::type;
        using Int32 = typename std::conditional<std::is_unsigned<T>::value, uint, int>::type;

        // we select the right overload by casting base to int or uint
        Int64 val = toIntegral_helper(string, ok, Int32(base));
        if (T(val) != val) {
            if (ok)
                *ok = false;
            val = 0;
        }
        return T(val);
    }